

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor **ppFVar1;
  FileDescriptor *this_00;
  uint8_t **ppuVar2;
  uint8_t *puVar3;
  bool bVar4;
  pointer ppFVar5;
  int *piVar6;
  ostream *poVar7;
  char *pcVar8;
  size_t sVar9;
  uint8_t *ptr;
  pointer ppFVar10;
  bool bVar11;
  FileDescriptor **key;
  FileDescriptor **key_00;
  ulong uVar12;
  int iVar13;
  FileDescriptor *dependency;
  void *data;
  CodedOutputStream coded_out;
  FileOutputStream out;
  FileDescriptorSet file_set;
  TransitiveDependencyOptions local_163;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_160;
  FileDescriptor *local_158;
  iterator local_150;
  CommandLineInterface *local_140;
  ulong local_138;
  CodedOutputStream local_130;
  undefined1 local_e0 [32];
  FileOutputStream local_c0;
  undefined1 local_78 [72];
  
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_78,(Arena *)0x0);
  local_e0._0_8_ = (uint8_t *)0x1;
  local_e0._8_8_ = (uint8_t *)0x0;
  if (this->imports_in_descriptor_set_ == false) {
    local_130.impl_.end_ = (uint8_t *)0x1;
    local_130.impl_.buffer_end_ = (uint8_t *)0x0;
    key_00 = (parsed_files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_160 = parsed_files;
    local_140 = this;
    if (key_00 != ppFVar1) {
      do {
        local_150.ctrl_ = (ctrl_t *)&local_130;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                    *)&local_c0,&local_150,key_00,key_00);
        key_00 = key_00 + 1;
      } while (key_00 != ppFVar1);
      ppFVar5 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppFVar10 = (parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar10 != ppFVar5) {
        uVar12 = 0;
        do {
          this_00 = ppFVar5[uVar12];
          if (0 < this_00->dependency_count_) {
            iVar13 = 0;
            local_138 = uVar12;
            do {
              local_158 = FileDescriptor::dependency(this_00,iVar13);
              local_c0.super_CopyingOutputStreamAdaptor._0_16_ =
                   absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                   ::find<google::protobuf::FileDescriptor_const*>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                               *)&local_130,&local_158);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          *)&local_130);
              local_150.ctrl_ = (ctrl_t *)0x0;
              bVar4 = absl::lts_20250127::container_internal::operator==
                                ((iterator *)&local_c0,&local_150);
              if (bVar4) {
                local_150.ctrl_ = local_e0;
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                ::EmplaceDecomposable::operator()
                          ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                            *)&local_c0,&local_150,&local_158,&local_158);
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < this_00->dependency_count_);
            ppFVar5 = (local_160->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            ppFVar10 = (local_160->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            uVar12 = local_138;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)ppFVar10 - (long)ppFVar5 >> 3));
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       *)&local_130);
    parsed_files = local_160;
    this = local_140;
  }
  local_163.include_json_name = true;
  local_163.include_source_code_info = this->source_info_in_descriptor_set_;
  local_163.retain_options = this->retain_options_in_descriptor_set_;
  ppFVar5 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    uVar12 = 0;
    do {
      GetTransitiveDependencies
                (this,ppFVar5[uVar12],
                 (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)local_e0,
                 (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)(local_78 + 0x28),
                 &local_163);
      uVar12 = uVar12 + 1;
      ppFVar5 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(parsed_files->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3
                             ));
  }
  do {
    iVar13 = open((this->descriptor_set_out_name_)._M_dataplus._M_p,0x241,0x1b6);
    if (-1 < iVar13) {
      io::FileOutputStream::FileOutputStream(&local_c0,iVar13,-1);
      local_130.impl_.is_serialization_deterministic_ =
           (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
      puVar3 = local_130.impl_.buffer_;
      local_130.impl_.had_error_ = false;
      local_130.impl_.aliasing_enabled_ = false;
      local_130.impl_.skip_check_consistency = false;
      local_130.impl_.end_ = puVar3;
      local_130.impl_.buffer_end_ = puVar3;
      local_130.impl_.stream_ = (ZeroCopyOutputStream *)&local_c0;
      local_130.cur_ = puVar3;
      local_130.start_count_ =
           io::CopyingOutputStreamAdaptor::ByteCount(&local_c0.super_CopyingOutputStreamAdaptor);
      bVar4 = io::CopyingOutputStreamAdaptor::Next
                        (&local_c0.super_CopyingOutputStreamAdaptor,&local_150.ctrl_,
                         (int *)&local_158);
      if (bVar4 && 0 < (int)(uint)local_158) {
        ppuVar2 = &((CodedOutputStream *)((long)local_150.ctrl_ + -0x50))->cur_;
        if ((uint)local_158 < 0x11) {
          ppuVar2 = (uint8_t **)puVar3;
        }
        local_130.impl_.end_ = (uint8_t *)((long)ppuVar2 + ((ulong)local_158 & 0xffffffff));
        local_130.impl_.buffer_end_ = (uint8_t *)local_150.ctrl_;
        local_130.cur_ = puVar3;
        if ((uint)local_158 >= 0x11) {
          local_130.impl_.buffer_end_ = (uint8_t *)(CodedOutputStream *)0x0;
          local_130.cur_ = (uint8_t *)local_150.ctrl_;
        }
      }
      local_130.impl_.is_serialization_deterministic_ = true;
      bVar4 = MessageLite::SerializeToCodedStream((MessageLite *)local_78,&local_130);
      if (bVar4) {
        io::CodedOutputStream::~CodedOutputStream(&local_130);
        bVar4 = io::FileOutputStream::Close(&local_c0);
        bVar11 = true;
        if (!bVar4) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (this->descriptor_set_out_name_)._M_dataplus._M_p,
                              (this->descriptor_set_out_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          pcVar8 = strerror(local_c0.copying_output_.errno_);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          goto LAB_001dbca9;
        }
      }
      else {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->descriptor_set_out_name_)._M_dataplus._M_p,
                            (this->descriptor_set_out_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        pcVar8 = strerror(local_c0.copying_output_.errno_);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        io::FileOutputStream::Close(&local_c0);
        io::CodedOutputStream::~CodedOutputStream(&local_130);
LAB_001dbca9:
        bVar11 = false;
      }
      io::FileOutputStream::~FileOutputStream(&local_c0);
      goto LAB_001dbcb8;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  perror((this->descriptor_set_out_name_)._M_dataplus._M_p);
  bVar11 = false;
LAB_001dbcb8:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_e0);
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_78);
  return bVar11;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  absl::flat_hash_set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    absl::flat_hash_set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (size_t i = 0; i < parsed_files.size(); ++i) {
      const FileDescriptor* file = parsed_files[i];
      for (int j = 0; j < file->dependency_count(); j++) {
        const FileDescriptor* dependency = file->dependency(j);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  TransitiveDependencyOptions options;
  options.include_json_name = true;
  options.include_source_code_info = source_info_in_descriptor_set_;
  options.retain_options = retain_options_in_descriptor_set_;
  for (size_t i = 0; i < parsed_files.size(); ++i) {
    GetTransitiveDependencies(parsed_files[i], &already_seen,
                              file_set.mutable_file(), options);
  }

  int fd;
  do {
    fd = open(descriptor_set_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);

  {
    io::CodedOutputStream coded_out(&out);
    // Determinism is useful here because build outputs are sometimes checked
    // into version control.
    coded_out.SetSerializationDeterministic(true);
    if (!file_set.SerializeToCodedStream(&coded_out)) {
      std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
                << std::endl;
      out.Close();
      return false;
    }
  }

  if (!out.Close()) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}